

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteLanguagesRules(cmNinjaNormalTargetGenerator *this)

{
  pointer *this_00;
  bool bVar1;
  cmGeneratorTarget *this_01;
  cmMakefile *this_02;
  string *config;
  reference ppcVar2;
  ulong uVar3;
  reference language_00;
  string *language;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_d0 [8];
  string lang;
  cmSourceFile *sf;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  string local_88;
  undefined1 local_58 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sourceFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmNinjaNormalTargetGenerator *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&sourceFiles.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58);
  this_01 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  this_02 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"CMAKE_BUILD_TYPE",(allocator<char> *)((long)&__range1 + 7));
  config = cmMakefile::GetSafeDefinition(this_02,&local_88);
  cmGeneratorTarget::GetObjectSources
            (this_01,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58
             ,config);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_58);
  sf = (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                *)&sf);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&__end1);
    lang.field_2._8_8_ = *ppcVar2;
    cmSourceFile::GetLanguage_abi_cxx11_((string *)local_d0,(cmSourceFile *)lang.field_2._8_8_);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourceFiles.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_d0);
    }
    std::__cxx11::string::~string((string *)local_d0);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  this_00 = &sourceFiles.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
  language = (string *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&language);
    if (!bVar1) break;
    language_00 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1_1);
    cmNinjaTargetGenerator::WriteLanguageRules(&this->super_cmNinjaTargetGenerator,language_00);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_58);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&sourceFiles.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLanguagesRules()
{
#ifdef NINJA_GEN_VERBOSE_FILES
  cmGlobalNinjaGenerator::WriteDivider(this->GetRulesFileStream());
  this->GetRulesFileStream()
    << "# Rules for each languages for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";
#endif

  // Write rules for languages compiled in this target.
  std::set<std::string> languages;
  std::vector<cmSourceFile const*> sourceFiles;
  this->GetGeneratorTarget()->GetObjectSources(
    sourceFiles, this->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  for (cmSourceFile const* sf : sourceFiles) {
    std::string const lang = sf->GetLanguage();
    if (!lang.empty()) {
      languages.insert(lang);
    }
  }
  for (std::string const& language : languages) {
    this->WriteLanguageRules(language);
  }
}